

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseEntry
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t size;
  char *__s1;
  size_t __n;
  stringpiece_ssize_type sVar3;
  int iVar4;
  _Elt_pointer pPVar5;
  _Elt_pointer pPVar6;
  stringpiece_ssize_type len;
  StringPiece message;
  StringPiece message_00;
  StringPiece message_01;
  Status local_58;
  
  if (type == END_OBJECT) {
    (*this->ow_->_vptr_ObjectWriter[3])();
    Advance(this);
    this->recursion_depth_ = this->recursion_depth_ + -1;
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (type == UNKNOWN) {
    message.length_ = 0x1c;
    message.ptr_ = "Expected an object key or }.";
    ReportUnknown(__return_storage_ptr__,this,message);
    return __return_storage_ptr__;
  }
  Status::Status(__return_storage_ptr__);
  if (type == BEGIN_KEY) {
    ParseKey(&local_58,this);
    Status::operator=(__return_storage_ptr__,&local_58);
LAB_0030ea4b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.error_message_._M_dataplus._M_p == &local_58.error_message_.field_2)
    goto LAB_0030ea7a;
  }
  else {
    if (type == BEGIN_STRING) {
      ParseStringHelper(&local_58,this);
      Status::operator=(__return_storage_ptr__,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.error_message_._M_dataplus._M_p != &local_58.error_message_.field_2) {
        operator_delete(local_58.error_message_._M_dataplus._M_p);
      }
      if (__return_storage_ptr__->error_code_ != OK) {
        return __return_storage_ptr__;
      }
      (this->key_storage_)._M_string_length = 0;
      *(this->key_storage_)._M_dataplus._M_p = '\0';
      if ((this->parsed_storage_)._M_string_length == 0) {
        sVar3 = (this->parsed_).length_;
        (this->key_).ptr_ = (this->parsed_).ptr_;
        (this->key_).length_ = sVar3;
      }
      else {
        std::__cxx11::string::swap((string *)&this->parsed_storage_);
        pcVar2 = (this->key_storage_)._M_dataplus._M_p;
        size = (this->key_storage_)._M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
        }
        (this->key_).ptr_ = pcVar2;
        (this->key_).length_ = size;
      }
      (this->parsed_).ptr_ = (char *)0x0;
      (this->parsed_).length_ = 0;
      goto LAB_0030ea7a;
    }
    if (2 < type - BEGIN_TRUE) {
      message_01.length_ = 0x1c;
      message_01.ptr_ = "Expected an object key or }.";
      ReportFailure(&local_58,this,message_01);
      Status::operator=(__return_storage_ptr__,&local_58);
      goto LAB_0030ea4b;
    }
    ParseKey(&local_58,this);
    Status::operator=(__return_storage_ptr__,&local_58);
    paVar1 = &local_58.error_message_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.error_message_._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.error_message_._M_dataplus._M_p);
    }
    if (__return_storage_ptr__->error_code_ != OK) {
      return __return_storage_ptr__;
    }
    __s1 = (this->key_).ptr_;
    __n = (this->key_).length_;
    if ((((__n != DAT_003c8000) ||
         ((0 < (long)__n && __s1 != kKeywordNull &&
          (iVar4 = bcmp(__s1,kKeywordNull,__n), iVar4 != 0)))) &&
        ((__n != DAT_003c7fe0 ||
         ((0 < (long)__n && __s1 != kKeywordTrue &&
          (iVar4 = bcmp(__s1,kKeywordTrue,__n), iVar4 != 0)))))) &&
       ((__n != DAT_003c7ff0 ||
        ((0 < (long)__n && __s1 != kKeywordFalse &&
         (iVar4 = bcmp(__s1,kKeywordFalse,__n), iVar4 != 0)))))) goto LAB_0030ea7a;
    message_00.length_ = 0x1c;
    message_00.ptr_ = "Expected an object key or }.";
    ReportFailure(&local_58,this,message_00);
    Status::operator=(__return_storage_ptr__,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.error_message_._M_dataplus._M_p == paVar1) goto LAB_0030ea7a;
  }
  operator_delete(local_58.error_message_._M_dataplus._M_p);
LAB_0030ea7a:
  if (__return_storage_ptr__->error_code_ == OK) {
    local_58.error_code_ = CANCELLED;
    pPVar5 = (this->stack_).c.
             super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pPVar6 = (this->stack_).c.
             super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
    if (pPVar5 == pPVar6 + -1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
                (&(this->stack_).c,&local_58.error_code_);
      pPVar5 = (this->stack_).c.
               super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pPVar6 = (this->stack_).c.
               super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
    }
    else {
      *pPVar5 = OBJ_MID;
      pPVar5 = pPVar5 + 1;
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar5;
    }
    local_58.error_code_ = INVALID_ARGUMENT;
    if (pPVar5 == pPVar6 + -1) {
      std::
      deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ::_M_push_back_aux<google::protobuf::util::converter::JsonStreamParser::ParseType>
                (&(this->stack_).c,&local_58.error_code_);
    }
    else {
      *pPVar5 = ENTRY_MID;
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = pPVar5 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseEntry(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected an object key or }.");
  }

  // Close the object and return. This allows for trailing commas.
  if (type == END_OBJECT) {
    ow_->EndObject();
    Advance();
    --recursion_depth_;
    return util::Status();
  }

  util::Status result;
  if (type == BEGIN_STRING) {
    // Key is a string (standard JSON), parse it and store the string.
    result = ParseStringHelper();
    if (result.ok()) {
      key_storage_.clear();
      if (!parsed_storage_.empty()) {
        parsed_storage_.swap(key_storage_);
        key_ = StringPiece(key_storage_);
      } else {
        key_ = parsed_;
      }
      parsed_ = StringPiece();
    }
  } else if (type == BEGIN_KEY) {
    // Key is a bare key (back compat), create a StringPiece pointing to it.
    result = ParseKey();
  } else if (type == BEGIN_NULL || type == BEGIN_TRUE || type == BEGIN_FALSE) {
    // Key may be a bare key that begins with a reserved word.
    result = ParseKey();
    if (result.ok() && (key_ == kKeywordNull || key_ == kKeywordTrue ||
                        key_ == kKeywordFalse)) {
      result = ReportFailure("Expected an object key or }.");
    }
  } else {
    // Unknown key type, report an error.
    result = ReportFailure("Expected an object key or }.");
  }
  // On success we next expect an entry mid ':' then an object mid ',' or '}'
  if (result.ok()) {
    stack_.push(OBJ_MID);
    stack_.push(ENTRY_MID);
  }
  return result;
}